

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O2

void __thiscall Iex::BaseExc::BaseExc(BaseExc *this,BaseExc *be)

{
  std::__cxx11::string::string((string *)&this->super_string,(string *)&be->super_string);
  *(undefined ***)this = &PTR__BaseExc_0015dd58;
  std::__cxx11::string::string((string *)&this->_stackTrace,(string *)&be->_stackTrace);
  return;
}

Assistant:

BaseExc::BaseExc (const BaseExc &be) throw () :
    std::string (be),
    _stackTrace (be._stackTrace)
{
    // empty
}